

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

string * gimage::getNewImageName(string *prefix)

{
  int iVar1;
  undefined1 uVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  ImageIO *name_00;
  ostream *poVar6;
  char *pcVar7;
  string *in_RSI;
  string *in_RDI;
  ifstream file;
  ostringstream out;
  int c;
  size_t i;
  string suffix;
  string *name;
  undefined1 in_stack_fffffffffffffb77;
  char *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  string local_450 [32];
  string local_430 [32];
  undefined1 local_410 [520];
  ostringstream local_208 [379];
  undefined1 local_8d;
  int local_8c;
  string local_88 [48];
  string local_58 [32];
  long local_38;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  local_38 = std::__cxx11::string::rfind((char)in_RSI,0x2e);
  if ((local_38 != -1) && (lVar5 = std::__cxx11::string::size(), (ulong)(lVar5 - local_38) < 5)) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)in_RSI);
    std::__cxx11::string::operator=(local_30,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::substr((ulong)local_88,(ulong)in_RSI);
    std::__cxx11::string::operator=(in_RSI,local_88);
    std::__cxx11::string::~string(local_88);
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    std::__cxx11::string::operator=(local_30,".ppm");
    getImageIO();
    uVar2 = ImageIO::handlesFile
                      ((ImageIO *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                       in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    if ((bool)uVar2) {
      std::__cxx11::string::operator=(local_30,".png");
    }
    else {
      name_00 = getImageIO();
      bVar3 = ImageIO::handlesFile
                        ((ImageIO *)CONCAT17(uVar2,in_stack_fffffffffffffb80),(char *)name_00,
                         (bool)in_stack_fffffffffffffb77);
      if (bVar3) {
        std::__cxx11::string::operator=(local_30,".tif");
      }
    }
  }
  local_8c = 0;
  local_8d = 0;
  std::__cxx11::string::string(in_RDI);
  while (lVar5 = std::__cxx11::string::size(), lVar5 == 0 && local_8c < 1000) {
    std::__cxx11::ostringstream::ostringstream(local_208);
    poVar6 = std::operator<<((ostream *)local_208,in_RSI);
    std::operator<<(poVar6,"_");
    if (local_8c < 100) {
      std::operator<<((ostream *)local_208,"0");
    }
    if (local_8c < 10) {
      std::operator<<((ostream *)local_208,"0");
    }
    iVar1 = local_8c;
    local_8c = local_8c + 1;
    poVar6 = (ostream *)std::ostream::operator<<(local_208,iVar1);
    std::operator<<(poVar6,local_30);
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_410,pcVar7,_S_in);
    std::__cxx11::string::~string(local_430);
    bVar4 = std::ifstream::is_open();
    if ((bVar4 & 1) == 0) {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(in_RDI,local_450);
      std::__cxx11::string::~string(local_450);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_410);
    std::__cxx11::ostringstream::~ostringstream(local_208);
  }
  local_8d = 1;
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string getNewImageName(std::string prefix)
{
  // try getting existing suffix

  std::string suffix;

  size_t i=prefix.rfind('.');

  if (i != prefix.npos && prefix.size()-i <= 4)
  {
    suffix=prefix.substr(i);
    prefix=prefix.substr(0, i);
  }

  // determine supported format for writing image

  if (suffix.size() == 0)
  {
    suffix=".ppm";

    if (getImageIO().handlesFile("file.png", false))
    {
      suffix=".png";
    }
    else if (getImageIO().handlesFile("file.tif", false))
    {
      suffix=".tif";
    }
  }

  // find file name that is not used

  int c=0;
  std::string name;

  while (name.size() == 0 && c < 1000)
  {
    std::ostringstream out;
    out << prefix << "_";

    if (c < 100)
    {
      out << "0";
    }

    if (c < 10)
    {
      out << "0";
    }

    out << c++ << suffix;

    std::ifstream file(out.str().c_str());

    if (!file.is_open())
    {
      name=out.str();
    }

    file.close();
  }

  return name;
}